

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn_avx2.c
# Opt level: O0

void cnn_convolve_no_maxpool_padding_valid_layer1_avx2
               (float **input,int in_stride,CNN_LAYER_CONFIG *layer_config,float **output,
               int out_stride,int start_idx,int cstep,int channel_step)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  __m256i shuffle_output_mask_00;
  long in_RCX;
  long lVar3;
  int *in_RDX;
  int in_R8D;
  int in_R9D;
  undefined1 auVar4 [32];
  int j_1;
  float *input_ptr;
  int u;
  int off;
  __m256 shuffle_weight [2];
  int k;
  int j;
  __m256 out_accum [8];
  __m256 bias_reg;
  int i;
  int kSkipHeight;
  int kFilterHeight;
  int kInHeight;
  __m256i shuffle_output_mask;
  __m256i weight_mask [2];
  int local_31c;
  int local_308;
  __m256i *in_stack_fffffffffffffd18;
  __m256 *in_stack_fffffffffffffd20;
  int in_stack_fffffffffffffd28;
  int in_stack_fffffffffffffd2c;
  float *in_stack_fffffffffffffd30;
  int iVar5;
  int iVar6;
  undefined1 in_stack_fffffffffffffd60 [24];
  __m256 *in_stack_fffffffffffffd78;
  __m256 *in_stack_fffffffffffffd80;
  int in_stack_fffffffffffffd8c;
  float *in_stack_fffffffffffffd90;
  int local_170;
  longlong local_160 [4];
  longlong local_140 [10];
  int local_f0;
  int local_ec;
  long local_e8;
  int *local_e0;
  uint local_c4;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 *local_88;
  undefined1 local_80 [32];
  uint local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  
  local_f0 = in_R9D;
  local_ec = in_R8D;
  local_e8 = in_RCX;
  local_e0 = in_RDX;
  load_shuffle_masks_for_2x2_convolve(&local_160,(__m256i *)local_140);
  for (local_170 = local_f0; local_170 < local_e0[3]; local_170 = cstep + local_170) {
    local_c4 = *(uint *)(*(long *)(local_e0 + 10) + (long)local_170 * 4);
    auVar1 = vinsertps_avx(ZEXT416(local_c4),ZEXT416(local_c4),0x10);
    auVar1 = vinsertps_avx(auVar1,ZEXT416(local_c4),0x20);
    auVar1 = vinsertps_avx(auVar1,ZEXT416(local_c4),0x30);
    auVar2 = vinsertps_avx(ZEXT416(local_c4),ZEXT416(local_c4),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(local_c4),0x20);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(local_c4),0x30);
    auVar4._16_16_ = auVar1;
    auVar4._0_16_ = auVar2;
    local_80._0_8_ = auVar2._0_8_;
    local_80._8_8_ = auVar2._8_8_;
    local_80._16_8_ = auVar1._0_8_;
    local_80._24_8_ = auVar1._8_8_;
    for (iVar6 = 0; iVar6 < 8; iVar6 = iVar6 + 1) {
      lVar3 = (long)iVar6 * 0x20;
      *(undefined8 *)(&stack0xfffffffffffffd60 + lVar3) = local_80._0_8_;
      *(undefined8 *)(&stack0xfffffffffffffd68 + lVar3) = local_80._8_8_;
      *(undefined8 *)(&stack0xfffffffffffffd70 + lVar3) = local_80._16_8_;
      *(undefined8 *)(&stack0xfffffffffffffd78 + lVar3) = local_80._24_8_;
    }
    local_80 = auVar4;
    local_50 = local_c4;
    local_4c = local_c4;
    local_48 = local_c4;
    local_44 = local_c4;
    local_40 = local_c4;
    local_3c = local_c4;
    local_38 = local_c4;
    local_34 = local_c4;
    for (iVar5 = 0; iVar5 < *local_e0; iVar5 = iVar5 + 1) {
      prepare_weights_for_2x2_convolve
                (in_stack_fffffffffffffd30,in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28,
                 in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
      for (local_308 = 0; local_308 < 0xf; local_308 = local_308 + 2) {
        shuffle_output_mask_00[0]._4_4_ = iVar6;
        shuffle_output_mask_00[0]._0_4_ = iVar5;
        shuffle_output_mask_00[1] = in_stack_fffffffffffffd60._0_8_;
        shuffle_output_mask_00[2] = in_stack_fffffffffffffd60._8_8_;
        shuffle_output_mask_00[3] = in_stack_fffffffffffffd60._16_8_;
        perform_convolve_for_8h_2x2_blocks
                  (in_stack_fffffffffffffd90,in_stack_fffffffffffffd8c,in_stack_fffffffffffffd80,
                   in_stack_fffffffffffffd78,shuffle_output_mask_00);
      }
    }
    for (local_31c = 0; local_31c < 8; local_31c = local_31c + 1) {
      local_88 = (undefined8 *)
                 (*(long *)(local_e8 + (long)local_170 * 8) + (long)(local_31c * local_ec) * 4);
      lVar3 = (long)local_31c * 0x20;
      local_c0 = *(undefined8 *)(&stack0xfffffffffffffd60 + lVar3);
      uStack_b8 = *(undefined8 *)(&stack0xfffffffffffffd68 + lVar3);
      uStack_b0 = *(undefined8 *)(&stack0xfffffffffffffd70 + lVar3);
      uStack_a8 = *(undefined8 *)(&stack0xfffffffffffffd78 + lVar3);
      *local_88 = local_c0;
      local_88[1] = uStack_b8;
      local_88[2] = uStack_b0;
      local_88[3] = uStack_a8;
    }
  }
  return;
}

Assistant:

static inline void cnn_convolve_no_maxpool_padding_valid_layer1_avx2(
    const float **input, int in_stride,
    const CNN_LAYER_CONFIG *const layer_config, float **output, int out_stride,
    int start_idx, const int cstep, const int channel_step) {
  __m256i weight_mask[2];
  __m256i shuffle_output_mask;
  load_shuffle_masks_for_2x2_convolve(&shuffle_output_mask, weight_mask);

  const int kInHeight = 16;
  const int kFilterHeight = 2;
  const int kSkipHeight = 2;
  for (int i = start_idx; i < layer_config->out_channels; i += channel_step) {
    __m256 bias_reg = _mm256_set1_ps(layer_config->bias[i]);
    // out_accum registers are used to store the 2x2 convolve outputs
    // (calculated over input block size), which are accumulated across the
    // in_channels. As per the design, each iteration of for loop processes 8
    // (horizontal) 2x2 blocks and stores in corresponding out_accum register
    // (as input size is 16x16, a total of 64 2x2 blocks are present and 8
    // out_accum registers are enough to store the outputs).
    // Hence for loops corresponding to 'j' and 'h', below, run over the number
    // of out_accum registers.
    __m256 out_accum[8];
    for (int j = 0; j < 8; ++j) out_accum[j] = bias_reg;
    for (int k = 0; k < layer_config->in_channels; ++k) {
      __m256 shuffle_weight[2];
      int off = k * layer_config->out_channels + i;
      // In layer 1, the convolution process happens at 2x2.
      // The weights needed for 2x2 block are same across the in-channels,
      // which is why the load of weights happens once for each in-channel.
      prepare_weights_for_2x2_convolve(layer_config->weights, off, cstep,
                                       shuffle_weight, weight_mask);

      for (int h = 0, u = 0; h < kInHeight - kFilterHeight + 1;
           h += kSkipHeight, ++u) {
        const float *input_ptr = &input[k][h * in_stride];
        perform_convolve_for_8h_2x2_blocks(input_ptr, in_stride, shuffle_weight,
                                           &out_accum[u], shuffle_output_mask);
      }
    }
    // Store output of layer 1.
    for (int j = 0; j < 8; ++j) {
      _mm256_storeu_ps(&output[i][j * out_stride], out_accum[j]);
    }
  }
}